

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

char * vrna_cut_point_remove(char *string,int *cp)

{
  size_t sVar1;
  char *pcVar2;
  char *pcStack_28;
  uint len;
  char *copy;
  char *pos;
  int *cp_local;
  char *string_local;
  
  pcStack_28 = (char *)0x0;
  *cp = -1;
  if (string != (char *)0x0) {
    sVar1 = strlen(string);
    pcStack_28 = strdup(string);
    copy = strchr(pcStack_28,0x26);
    if (copy != (char *)0x0) {
      *cp = ((int)copy - (int)pcStack_28) + 1;
      if ((uint)sVar1 <= (uint)*cp) {
        *cp = -1;
      }
      pcVar2 = strchr(copy + 1,0x26);
      if (pcVar2 != (char *)0x0) {
        vrna_message_error("more than one cut-point in input");
      }
      for (; *copy != '\0'; copy = copy + 1) {
        *copy = copy[1];
      }
    }
  }
  return pcStack_28;
}

Assistant:

PUBLIC char *
vrna_cut_point_remove(const char  *string,
                      int         *cp)
{
  char *pos, *copy = NULL;
  unsigned int len;

  *cp = -1;

  if (string) {
    len = strlen(string);
    copy = strdup(string);
    if ((pos = strchr(copy, '&'))) {
      *cp = (int)(pos - copy) + 1;
      if (*cp >= len)
        *cp = -1;

      if (strchr(pos + 1, '&'))
        vrna_message_error("more than one cut-point in input");

      for (; *pos; pos++)
        *pos = *(pos + 1);               /* splice out the & */
    }
  }

  return copy;
}